

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableBeginCell(ImGuiTable *table,int column_n)

{
  ImGuiWindow *window_00;
  ImGuiContext *pIVar1;
  ImGuiTableColumn *pIVar2;
  float fVar3;
  ImGuiContext *g;
  ImGuiContext *g_1;
  float start_x;
  ImGuiWindow *window;
  ImGuiTableColumn *column;
  int column_n_local;
  ImGuiTable *table_local;
  
  pIVar2 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,column_n);
  window_00 = table->InnerWindow;
  table->CurrentColumn = column_n;
  g_1._4_4_ = pIVar2->WorkMinX;
  if ((pIVar2->Flags & 0x10000U) != 0) {
    g_1._4_4_ = table->RowIndentOffsetX + g_1._4_4_;
  }
  (window_00->DC).CursorPos.x = g_1._4_4_;
  (window_00->DC).CursorPos.y = table->RowPosY1 + table->CellPaddingY;
  (window_00->DC).CursorMaxPos.x = (window_00->DC).CursorPos.x;
  (window_00->DC).ColumnsOffset.x = (g_1._4_4_ - (window_00->Pos).x) - (window_00->DC).Indent.x;
  (window_00->DC).CurrLineTextBaseOffset = table->RowTextBaseline;
  (window_00->DC).NavLayerCurrent = (int)pIVar2->NavLayerCurrent;
  (window_00->WorkRect).Min.y = (window_00->DC).CursorPos.y;
  (window_00->WorkRect).Min.x = pIVar2->WorkMinX;
  (window_00->WorkRect).Max.x = pIVar2->WorkMaxX;
  (window_00->DC).ItemWidth = pIVar2->ItemWidth;
  if ((pIVar2->IsEnabled & 1U) == 0) {
    fVar3 = ImMax<float>((window_00->DC).CursorPos.y,table->RowPosY2);
    (window_00->DC).CursorPos.y = fVar3;
  }
  window_00->SkipItems = (bool)(pIVar2->IsSkipItems & 1);
  pIVar1 = GImGui;
  if ((pIVar2->IsSkipItems & 1U) != 0) {
    (GImGui->LastItemData).ID = 0;
    (pIVar1->LastItemData).StatusFlags = 0;
  }
  if ((table->Flags & 0x100000U) == 0) {
    SetWindowClipRectBeforeSetChannel(window_00,&pIVar2->ClipRect);
    ImDrawListSplitter::SetCurrentChannel
              (table->DrawSplitter,window_00->DrawList,(uint)pIVar2->DrawChannelCurrent);
  }
  else {
    ImDrawListSplitter::SetCurrentChannel(table->DrawSplitter,window_00->DrawList,2);
  }
  pIVar1 = GImGui;
  if (((GImGui->LogEnabled & 1U) != 0) && ((pIVar2->IsSkipItems & 1U) == 0)) {
    LogRenderedText(&(window_00->DC).CursorPos,"|",(char *)0x0);
    pIVar1->LogLinePosY = 3.4028235e+38;
  }
  return;
}

Assistant:

void ImGui::TableBeginCell(ImGuiTable* table, int column_n)
{
    ImGuiTableColumn* column = &table->Columns[column_n];
    ImGuiWindow* window = table->InnerWindow;
    table->CurrentColumn = column_n;

    // Start position is roughly ~~ CellRect.Min + CellPadding + Indent
    float start_x = column->WorkMinX;
    if (column->Flags & ImGuiTableColumnFlags_IndentEnable)
        start_x += table->RowIndentOffsetX; // ~~ += window.DC.Indent.x - table->HostIndentX, except we locked it for the row.

    window->DC.CursorPos.x = start_x;
    window->DC.CursorPos.y = table->RowPosY1 + table->CellPaddingY;
    window->DC.CursorMaxPos.x = window->DC.CursorPos.x;
    window->DC.ColumnsOffset.x = start_x - window->Pos.x - window->DC.Indent.x; // FIXME-WORKRECT
    window->DC.CurrLineTextBaseOffset = table->RowTextBaseline;
    window->DC.NavLayerCurrent = (ImGuiNavLayer)column->NavLayerCurrent;

    window->WorkRect.Min.y = window->DC.CursorPos.y;
    window->WorkRect.Min.x = column->WorkMinX;
    window->WorkRect.Max.x = column->WorkMaxX;
    window->DC.ItemWidth = column->ItemWidth;

    // To allow ImGuiListClipper to function we propagate our row height
    if (!column->IsEnabled)
        window->DC.CursorPos.y = ImMax(window->DC.CursorPos.y, table->RowPosY2);

    window->SkipItems = column->IsSkipItems;
    if (column->IsSkipItems)
    {
        ImGuiContext& g = *GImGui;
        g.LastItemData.ID = 0;
        g.LastItemData.StatusFlags = 0;
    }

    if (table->Flags & ImGuiTableFlags_NoClip)
    {
        // FIXME: if we end up drawing all borders/bg in EndTable, could remove this and just assert that channel hasn't changed.
        table->DrawSplitter->SetCurrentChannel(window->DrawList, TABLE_DRAW_CHANNEL_NOCLIP);
        //IM_ASSERT(table->DrawSplitter._Current == TABLE_DRAW_CHANNEL_NOCLIP);
    }
    else
    {
        // FIXME-TABLE: Could avoid this if draw channel is dummy channel?
        SetWindowClipRectBeforeSetChannel(window, column->ClipRect);
        table->DrawSplitter->SetCurrentChannel(window->DrawList, column->DrawChannelCurrent);
    }

    // Logging
    ImGuiContext& g = *GImGui;
    if (g.LogEnabled && !column->IsSkipItems)
    {
        LogRenderedText(&window->DC.CursorPos, "|");
        g.LogLinePosY = FLT_MAX;
    }
}